

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
               (vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *headers,string *fn,
               string *failMessage)

{
  char *fileName;
  Header *headers_00;
  pointer pHVar1;
  int numThreads;
  ostream *poVar2;
  MultiPartOutputFile file;
  MultiPartOutputFile local_30;
  
  remove((fn->_M_dataplus)._M_p);
  fileName = (fn->_M_dataplus)._M_p;
  headers_00 = (headers->super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>).
               _M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (headers->super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  numThreads = Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
            (&local_30,fileName,headers_00,
             (int)((ulong)((long)pHVar1 - (long)headers_00) >> 3) * -0x49249249,false,numThreads);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR -- ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(failMessage->_M_dataplus)._M_p,
                      failMessage->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartSharedAttributes.cpp"
                ,0xa2,
                "void (anonymous namespace)::testMultiPartOutputFileForExpectedFailure(const vector<Header> &, const std::string &, const string &)"
               );
}

Assistant:

void
testMultiPartOutputFileForExpectedFailure (const vector<Header> & headers,
                                           const std::string & fn,
                                           const string & failMessage="")
{
    bool caught = false;

    try
    {
        remove(fn.c_str());
        MultiPartOutputFile file(fn.c_str(), headers.data() , headers.size() );
        cerr << "ERROR -- " << failMessage << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc & e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);
}